

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktShaderRenderTextureGatherTests.cpp
# Opt level: O2

int __thiscall
vkt::sr::anon_unknown_0::TextureGatherInstance::init(TextureGatherInstance *this,EVP_PKEY_CTX *ctx)

{
  ostringstream *poVar1;
  ostringstream *this_00;
  ostringstream *this_01;
  ostringstream *this_02;
  int iVar2;
  deUint32 dVar3;
  Context *this_03;
  TestLog *pTVar4;
  VkComponentSwizzle VVar5;
  VkComponentSwizzle VVar6;
  VkComponentSwizzle VVar7;
  VkComponentSwizzle VVar8;
  VkSamplerAddressMode VVar9;
  VkFilter VVar10;
  VkCompareOp value;
  int extraout_EAX;
  VkPhysicalDeviceFeatures *pVVar11;
  VkPhysicalDeviceProperties *pVVar12;
  MessageBuilder *this_04;
  ostream *poVar13;
  NotSupportedError *this_05;
  TestError *pTVar14;
  string *psVar15;
  undefined8 uVar16;
  void *__buf;
  void *__buf_00;
  undefined8 uVar17;
  char *pcVar18;
  allocator<char> local_6ce;
  allocator<char> local_6cd;
  allocator<char> local_6cc;
  allocator<char> local_6cb;
  allocator<char> local_6ca;
  allocator<char> local_6c9;
  TextureBindingSp textureBinding;
  string local_6b0;
  string local_690;
  string local_670;
  string local_650;
  MessageBuilder local_630;
  MessageBuilder local_4b0;
  MessageBuilder local_330;
  MessageBuilder local_1b0;
  
  this_03 = (this->super_ShaderRenderCaseInstance).super_TestInstance.m_context;
  pTVar4 = this_03->m_testCtx->m_log;
  textureBinding.m_ptr = (TextureBinding *)0x0;
  textureBinding.m_state = (SharedPtrStateBase *)0x0;
  if ((((this->m_baseParams).gatherType & ~GATHERTYPE_OFFSET) == GATHERTYPE_OFFSET_DYNAMIC) ||
     ((this->m_baseParams).offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM)) {
    pVVar11 = Context::getDeviceFeatures(this_03);
    if (pVVar11->shaderImageGatherExtended == 0) {
      this_05 = (NotSupportedError *)__cxa_allocate_exception(0x38);
      tcu::NotSupportedError::NotSupportedError
                (this_05,"Extended set of image gather instructions are not supported",(char *)0x0,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureGatherTests.cpp"
                 ,0x493);
      __cxa_throw(this_05,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
    }
    if ((this->m_baseParams).offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM) {
      pVVar12 = Context::getDeviceProperties
                          ((this->super_ShaderRenderCaseInstance).super_TestInstance.m_context);
      iVar2 = (pVVar12->limits).minTexelGatherOffset;
      dVar3 = (pVVar12->limits).maxTexelGatherOffset;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_330,"ImplementationMinTextureGatherOffset",&local_6c9);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_1b0,"Implementation\'s value for minTexelGatherOffset",&local_6ca)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_650,"",&local_6cb);
      psVar15 = &local_650;
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)&local_630,(string *)&local_330,(string *)&local_1b0,psVar15,
                 QP_KEY_TAG_NONE,(long)iVar2);
      tcu::LogNumber<long>::write((LogNumber<long> *)&local_630,(int)pTVar4,__buf,(size_t)psVar15);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_670,"ImplementationMaxTextureGatherOffset",&local_6cc);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_690,"Implementation\'s value for maxTexelGatherOffset",&local_6cd)
      ;
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_6b0,"",&local_6ce);
      psVar15 = &local_6b0;
      tcu::LogNumber<long>::LogNumber
                ((LogNumber<long> *)&local_4b0,&local_670,&local_690,psVar15,QP_KEY_TAG_NONE,
                 (long)(int)dVar3);
      tcu::LogNumber<long>::write
                ((LogNumber<long> *)&local_4b0,(int)pTVar4,__buf_00,(size_t)psVar15);
      tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&local_4b0);
      std::__cxx11::string::~string((string *)&local_6b0);
      std::__cxx11::string::~string((string *)&local_690);
      std::__cxx11::string::~string((string *)&local_670);
      tcu::LogNumber<long>::~LogNumber((LogNumber<long> *)&local_630);
      std::__cxx11::string::~string((string *)&local_650);
      std::__cxx11::string::~string((string *)&local_1b0);
      std::__cxx11::string::~string((string *)&local_330);
      if (-8 < iVar2) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        local_330.m_log = (TestLog *)CONCAT44(local_330.m_log._4_4_,0xfffffff8);
        de::toString<int>((string *)&local_4b0,(int *)&local_330);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_630,"minTexelGatherOffset must be at most ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_4b0);
        tcu::TestError::TestError
                  (pTVar14,(char *)local_630.m_log,"offsetRange[0] <= SPEC_MAX_MIN_OFFSET",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureGatherTests.cpp"
                   ,0x49c);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
      if ((int)dVar3 < 7) {
        pTVar14 = (TestError *)__cxa_allocate_exception(0x38);
        local_330.m_log = (TestLog *)CONCAT44(local_330.m_log._4_4_,7);
        de::toString<int>((string *)&local_4b0,(int *)&local_330);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_630,"maxTexelGatherOffset must be at least ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_4b0);
        tcu::TestError::TestError
                  (pTVar14,(char *)local_630.m_log,"offsetRange[1] >= SPEC_MIN_MAX_OFFSET",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/shaderrender/vktShaderRenderTextureGatherTests.cpp"
                   ,0x49d);
        __cxa_throw(pTVar14,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
  }
  (*(this->super_ShaderRenderCaseInstance).super_TestInstance._vptr_TestInstance[9])
            (&local_630,this);
  de::SharedPtr<vkt::sr::TextureBinding>::operator=
            (&textureBinding,(SharedPtr<vkt::sr::TextureBinding> *)&local_630);
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr
            ((SharedPtr<vkt::sr::TextureBinding> *)&local_630);
  if ((this->m_baseParams).textureSwizzle.m_isSome == true) {
    VVar5 = getTextureSwizzleComponent((this->m_baseParams).textureSwizzle.m_swizzle.m_data[0]);
    VVar6 = getTextureSwizzleComponent((this->m_baseParams).textureSwizzle.m_swizzle.m_data[1]);
    VVar7 = getTextureSwizzleComponent((this->m_baseParams).textureSwizzle.m_swizzle.m_data[2]);
    VVar8 = getTextureSwizzleComponent((this->m_baseParams).textureSwizzle.m_swizzle.m_data[3]);
    uVar16 = CONCAT44(VVar6,VVar5);
    uVar17 = CONCAT44(VVar8,VVar7);
  }
  else {
    uVar17 = 0x600000005;
    uVar16 = 0x400000003;
  }
  ((textureBinding.m_ptr)->m_params).baseMipLevel = (this->m_baseParams).baseLevel;
  ((textureBinding.m_ptr)->m_params).componentMapping.r = (int)uVar16;
  ((textureBinding.m_ptr)->m_params).componentMapping.g = (int)((ulong)uVar16 >> 0x20);
  ((textureBinding.m_ptr)->m_params).componentMapping.b = (int)uVar17;
  ((textureBinding.m_ptr)->m_params).componentMapping.a = (int)((ulong)uVar17 >> 0x20);
  ((textureBinding.m_ptr)->m_params).samples = VK_SAMPLE_COUNT_1_BIT;
  ((textureBinding.m_ptr)->m_params).initialization = INIT_UPLOAD_DATA;
  std::
  vector<de::SharedPtr<vkt::sr::TextureBinding>,_std::allocator<de::SharedPtr<vkt::sr::TextureBinding>_>_>
  ::push_back(&(this->super_ShaderRenderCaseInstance).m_textures,&textureBinding);
  poVar1 = &local_1b0.m_str;
  local_1b0.m_log = pTVar4;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
  std::operator<<((ostream *)poVar1,"Texture base level is ");
  this_04 = tcu::MessageBuilder::operator<<(&local_1b0,&(this->m_baseParams).baseLevel);
  local_330.m_log =
       tcu::MessageBuilder::operator<<(this_04,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_00 = &local_330.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"s and t wrap modes are ");
  VVar9 = ::vk::mapWrapMode((this->m_baseParams).wrapS);
  ::vk::operator<<((ostream *)this_00,VVar9);
  std::operator<<((ostream *)this_00," and ");
  VVar9 = ::vk::mapWrapMode((this->m_baseParams).wrapT);
  ::vk::operator<<((ostream *)this_00,VVar9);
  std::operator<<((ostream *)this_00,", respectively");
  local_4b0.m_log =
       tcu::MessageBuilder::operator<<(&local_330,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_01 = &local_4b0.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_01);
  std::operator<<((ostream *)this_01,"Minification and magnification filter modes are ");
  VVar10 = ::vk::mapFilterMode((this->m_baseParams).minFilter);
  ::vk::operator<<((ostream *)this_01,VVar10);
  std::operator<<((ostream *)this_01," and ");
  VVar10 = ::vk::mapFilterMode((this->m_baseParams).magFilter);
  ::vk::operator<<((ostream *)this_01,VVar10);
  std::operator<<((ostream *)this_01,", respectively ");
  std::operator<<((ostream *)this_01,"(note that they should have no effect on gather result)");
  local_630.m_log =
       tcu::MessageBuilder::operator<<(&local_4b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  this_02 = &local_630.m_str;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_02);
  std::operator<<((ostream *)this_02,"Using texture swizzle ");
  if ((this->m_baseParams).textureSwizzle.m_isSome == true) {
    poVar13 = std::operator<<((ostream *)this_02,"(");
    poVar13 = anon_unknown_0::operator<<
                        (poVar13,(this->m_baseParams).textureSwizzle.m_swizzle.m_data[0]);
    poVar13 = std::operator<<(poVar13,", ");
    poVar13 = anon_unknown_0::operator<<
                        (poVar13,(this->m_baseParams).textureSwizzle.m_swizzle.m_data[1]);
    poVar13 = std::operator<<(poVar13,", ");
    poVar13 = anon_unknown_0::operator<<
                        (poVar13,(this->m_baseParams).textureSwizzle.m_swizzle.m_data[2]);
    poVar13 = std::operator<<(poVar13,", ");
    poVar13 = anon_unknown_0::operator<<
                        (poVar13,(this->m_baseParams).textureSwizzle.m_swizzle.m_data[3]);
    pcVar18 = ")";
  }
  else {
    pcVar18 = "[default swizzle state]";
    poVar13 = (ostream *)this_02;
  }
  std::operator<<(poVar13,pcVar18);
  tcu::MessageBuilder::operator<<(&local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_02);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  if ((this->m_baseParams).shadowCompareMode != COMPAREMODE_NONE) {
    poVar1 = &local_630.m_str;
    local_630.m_log = pTVar4;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)poVar1);
    std::operator<<((ostream *)poVar1,"Using texture compare func ");
    value = ::vk::mapCompareMode((this->m_baseParams).shadowCompareMode);
    ::vk::operator<<((ostream *)poVar1,value);
    tcu::MessageBuilder::operator<<(&local_630,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)poVar1);
  }
  de::SharedPtr<vkt::sr::TextureBinding>::~SharedPtr(&textureBinding);
  return extraout_EAX;
}

Assistant:

void TextureGatherInstance::init (void)
{
	TestLog&						log					= m_context.getTestContext().getLog();
	TextureBindingSp				textureBinding;
	TextureBinding::Parameters		textureParams;

	// Check prerequisites.
	if (requireGpuShader5(m_baseParams.gatherType, m_baseParams.offsetSize))
	{
		const vk::VkPhysicalDeviceFeatures&		deviceFeatures	= m_context.getDeviceFeatures();
		if (!deviceFeatures.shaderImageGatherExtended)
			TCU_THROW(NotSupportedError, "Extended set of image gather instructions are not supported");
	}

	// Log and check implementation offset limits, if appropriate.
	if (m_baseParams.offsetSize == OFFSETSIZE_IMPLEMENTATION_MAXIMUM)
	{
		const IVec2		offsetRange		= getOffsetRange(m_baseParams.offsetSize, m_context.getDeviceProperties().limits);
		log << TestLog::Integer("ImplementationMinTextureGatherOffset", "Implementation's value for minTexelGatherOffset", "", QP_KEY_TAG_NONE, offsetRange[0])
			<< TestLog::Integer("ImplementationMaxTextureGatherOffset", "Implementation's value for maxTexelGatherOffset", "", QP_KEY_TAG_NONE, offsetRange[1]);
		TCU_CHECK_MSG(offsetRange[0] <= SPEC_MAX_MIN_OFFSET, ("minTexelGatherOffset must be at most " + de::toString((int)SPEC_MAX_MIN_OFFSET)).c_str());
		TCU_CHECK_MSG(offsetRange[1] >= SPEC_MIN_MAX_OFFSET, ("maxTexelGatherOffset must be at least " + de::toString((int)SPEC_MIN_MAX_OFFSET)).c_str());
	}

	// Initialize texture.

	textureBinding = createTexture();

	if (m_baseParams.textureSwizzle.isSome())
	{
		const tcu::Vector<TextureSwizzleComponent, 4>&	swizzle		= m_baseParams.textureSwizzle.getSwizzle();

		const vk::VkComponentMapping					components	=
		{
			getTextureSwizzleComponent(swizzle[0]),
			getTextureSwizzleComponent(swizzle[1]),
			getTextureSwizzleComponent(swizzle[2]),
			getTextureSwizzleComponent(swizzle[3])
		};

		textureParams.componentMapping = components;
	}

	if (m_baseParams.baseLevel != 0)
		textureParams.baseMipLevel = m_baseParams.baseLevel;

	textureBinding->setParameters(textureParams);
	m_textures.push_back(textureBinding);

	log << TestLog::Message << "Texture base level is " << m_baseParams.baseLevel << TestLog::EndMessage
		<< TestLog::Message << "s and t wrap modes are "
							<< vk::mapWrapMode(m_baseParams.wrapS) << " and "
							<< vk::mapWrapMode(m_baseParams.wrapT) << ", respectively" << TestLog::EndMessage
		<< TestLog::Message << "Minification and magnification filter modes are "
							<< vk::mapFilterMode(m_baseParams.minFilter) << " and "
							<< vk::mapFilterMode(m_baseParams.magFilter) << ", respectively "
							<< "(note that they should have no effect on gather result)"
							<< TestLog::EndMessage
		<< TestLog::Message << "Using texture swizzle " << m_baseParams.textureSwizzle << TestLog::EndMessage;

	if (m_baseParams.shadowCompareMode != tcu::Sampler::COMPAREMODE_NONE)
		log << TestLog::Message << "Using texture compare func " << vk::mapCompareMode(m_baseParams.shadowCompareMode) << TestLog::EndMessage;
}